

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O0

uint16 SIIcrc(uint8 *buf)

{
  uint8 b;
  byte local_15;
  int local_14;
  uint8 crc;
  uint8 *puStack_10;
  int i;
  uint8 *buf_local;
  
  local_15 = 0xff;
  puStack_10 = buf;
  for (local_14 = 0; local_14 < 0xe; local_14 = local_14 + 1) {
    b = *puStack_10;
    puStack_10 = puStack_10 + 1;
    calc_crc(&local_15,b);
  }
  return (uint16)local_15;
}

Assistant:

uint16 SIIcrc(uint8 *buf)
{
   int i; 
   uint8 crc;
    
   crc = 0xff; 
   for( i = 0 ; i <= 13 ; i++ )
   {
      calc_crc(&crc , *(buf++));  
   } 
   return (uint16)crc;
}